

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

art_ref_t art_node_erase(art_t *art,art_inner_node_t *node,art_typecode_t typecode,
                        art_key_chunk_t key_chunk)

{
  byte *pbVar1;
  uint8_t uVar2;
  short sVar3;
  art_node_t *paVar4;
  art_ref_t child;
  byte bVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  long lVar9;
  long lVar10;
  art_inner_node_t *paVar11;
  long lVar12;
  size_t i_1;
  ulong uVar13;
  art_node_t **ppaVar14;
  size_t i;
  art_typecode_t typecode_1;
  size_t sVar15;
  
  paVar11 = node;
  switch((int)CONCAT71(in_register_00000011,typecode)) {
  case 2:
    bVar5 = node[1].prefix_size;
    if ((ulong)bVar5 != 0) {
      uVar7 = 0xffffffff;
      uVar13 = 0;
      do {
        if (node[1].prefix[uVar13] == key_chunk) {
          uVar7 = uVar13 & 0xffffffff;
        }
        uVar13 = uVar13 + 1;
      } while (bVar5 != uVar13);
      uVar8 = (uint)uVar7;
      if (uVar8 != 0xffffffff) {
        if (bVar5 == 2) {
          uVar13 = uVar7 & 0xff ^ 1;
          uVar7 = *(ulong *)((long)node + uVar13 * 8 + 0x10);
          if ((uVar7 & 0xff) != 1) {
            uVar2 = node[1].prefix[uVar13];
            uVar13 = (ulong)(uint)((int)(uVar7 & 0xff) << 3);
            lVar10 = *(long *)((long)art->nodes + uVar13);
            lVar9 = (uVar7 >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar13);
            lVar12 = lVar10 + lVar9;
            pbVar1 = (byte *)(lVar10 + lVar9);
            memmove((void *)((ulong)node->prefix_size + lVar12 + 2),pbVar1 + 1,(ulong)*pbVar1);
            memcpy(pbVar1 + 1,node->prefix,(ulong)node->prefix_size);
            *(uint8_t *)((ulong)node->prefix_size + 1 + lVar12) = uVar2;
            *pbVar1 = node->prefix_size + *pbVar1 + 1;
          }
          paVar4 = art->nodes[2];
          *(uint64_t *)node = art->first_free[2];
          art->first_free[2] = ((long)node - (long)paVar4 >> 4) * -0x5555555555555555;
          return uVar7;
        }
        lVar12 = (long)(int)uVar8;
        sVar15 = (size_t)(int)(~uVar8 + (uint)bVar5);
        memmove(node[1].prefix + lVar12,node[1].prefix + lVar12 + 1,sVar15);
        memmove((void *)((long)node + lVar12 * 8 + 0x10),(void *)((long)node + lVar12 * 8 + 0x18),
                sVar15 << 3);
        node[1].prefix_size = node[1].prefix_size + 0xff;
      }
    }
    return ((ulong)((long)node - (long)art->nodes[2]) >> 4) * -0x5555555555550000 | 2;
  case 3:
    bVar5 = node[1].prefix_size;
    uVar7 = (ulong)bVar5;
    if (uVar7 != 0) {
      sVar15 = uVar7 * 8;
      uVar13 = 0;
      do {
        sVar15 = sVar15 - 8;
        if (node[1].prefix[uVar13] == key_chunk) {
          memmove(node[1].prefix + uVar13,node[1].prefix + uVar13 + 1,~uVar13 + uVar7);
          memmove((void *)((long)node + uVar13 * 8 + 0x18),(void *)((long)node + uVar13 * 8 + 0x20),
                  sVar15);
          bVar5 = node[1].prefix_size - 1;
          node[1].prefix_size = bVar5;
          break;
        }
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
      if (4 < bVar5) {
        ppaVar14 = art->nodes + 3;
        uVar7 = 3;
        lVar12 = 0x98;
        break;
      }
    }
    bVar5 = node->prefix_size;
    uVar6 = art_allocate_index(art,'\x02');
    ppaVar14 = art->nodes + 2;
    paVar11 = (art_inner_node_t *)((long)art->nodes[2] + uVar6 * 0x30);
    pbVar1 = (byte *)((long)art->nodes[2] + uVar6 * 0x30);
    *pbVar1 = bVar5;
    memcpy(pbVar1 + 1,node->prefix,(ulong)bVar5);
    pbVar1[6] = 0;
    lVar12 = 3;
    do {
      art_node4_insert(art,(art_node4_t *)paVar11,*(art_ref_t *)((long)node + lVar12 * 8),
                       node->prefix[lVar12 + 3]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 7);
    paVar4 = art->nodes[3];
    *(uint64_t *)node = art->first_free[3];
    art->first_free[3] = ((long)node - (long)paVar4 >> 3) * -0x79435e50d79435e5;
    uVar7 = 2;
    lVar12 = 0x30;
    break;
  case 4:
    bVar5 = node[2].prefix[(ulong)key_chunk + 3];
    if (bVar5 == 0x30) {
LAB_0010644f:
      ppaVar14 = art->nodes + 4;
      uVar7 = 4;
      lVar12 = 0x290;
    }
    else {
      node[2].prefix[(ulong)key_chunk + 3] = '0';
      *(ulong *)(node[1].prefix + 1) = *(ulong *)(node[1].prefix + 1) | 1L << (bVar5 & 0x3f);
      bVar5 = node[1].prefix_size - 1;
      node[1].prefix_size = bVar5;
      if (0x10 < bVar5) goto LAB_0010644f;
      bVar5 = node->prefix_size;
      uVar6 = art_allocate_index(art,'\x03');
      ppaVar14 = art->nodes + 3;
      paVar11 = (art_inner_node_t *)((long)art->nodes[3] + uVar6 * 0x98);
      pbVar1 = (byte *)((long)art->nodes[3] + uVar6 * 0x98);
      *pbVar1 = bVar5;
      memcpy(pbVar1 + 1,node->prefix,(ulong)bVar5);
      pbVar1[6] = 0;
      lVar12 = 0;
      do {
        if ((ulong)node[2].prefix[lVar12 + 3] != 0x30) {
          art_node16_insert(art,(art_node16_t *)paVar11,
                            *(art_ref_t *)
                             ((long)node + (ulong)node[2].prefix[lVar12 + 3] * 8 + 0x110),
                            (uint8_t)lVar12);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x100);
      paVar4 = art->nodes[4];
      *(uint64_t *)node = art->first_free[4];
      art->first_free[4] = ((long)node - (long)paVar4 >> 4) * -0x7063e7063e7063e7;
      uVar7 = 3;
      lVar12 = 0x98;
    }
    lVar10 = (long)paVar11 - (long)*ppaVar14;
    goto LAB_00106771;
  case 5:
    *(undefined8 *)((long)node + (ulong)key_chunk * 8 + 8) = 0;
    sVar3 = *(short *)(node + 1);
    *(ushort *)(node + 1) = sVar3 - 1U;
    if ((ushort)(sVar3 - 1U) < 0x31) {
      bVar5 = node->prefix_size;
      uVar6 = art_allocate_index(art,'\x04');
      ppaVar14 = art->nodes + 4;
      paVar4 = art->nodes[4];
      lVar12 = uVar6 * 0x290;
      paVar11 = (art_inner_node_t *)((long)paVar4 + lVar12);
      pbVar1 = (byte *)((long)paVar4 + lVar12);
      *pbVar1 = bVar5;
      memcpy(pbVar1 + 1,node->prefix,(ulong)bVar5);
      pbVar1[6] = 0;
      pbVar1[8] = 0xff;
      pbVar1[9] = 0xff;
      pbVar1[10] = 0xff;
      pbVar1[0xb] = 0xff;
      pbVar1[0xc] = 0xff;
      pbVar1[0xd] = 0xff;
      pbVar1[0xe] = 0;
      pbVar1[0xf] = 0;
      memset((void *)((long)paVar4 + lVar12 + 0x10),0x30,0x100);
      lVar12 = 0;
      do {
        child = *(art_ref_t *)((long)node + lVar12 * 8 + 8);
        if (child != 0) {
          art_node48_insert(art,(art_node48_t *)paVar11,child,(uint8_t)lVar12);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x100);
      paVar4 = art->nodes[5];
      *(uint64_t *)node = art->first_free[5];
      art->first_free[5] = ((long)node - (long)paVar4 >> 3) * -0xff00ff00ff00ff;
      uVar7 = 4;
      lVar12 = 0x290;
    }
    else {
      ppaVar14 = art->nodes + 5;
      uVar7 = 5;
      lVar12 = 0x808;
    }
    break;
  default:
    return 0;
  }
  lVar10 = (long)paVar11 - (long)*ppaVar14;
LAB_00106771:
  return lVar10 / lVar12 << 0x10 | uVar7;
}

Assistant:

static art_ref_t art_node_erase(art_t *art, art_inner_node_t *node,
                                art_typecode_t typecode,
                                art_key_chunk_t key_chunk) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            return art_node4_erase(art, (art_node4_t *)node, key_chunk);
        case CROARING_ART_NODE16_TYPE:
            return art_node16_erase(art, (art_node16_t *)node, key_chunk);
        case CROARING_ART_NODE48_TYPE:
            return art_node48_erase(art, (art_node48_t *)node, key_chunk);
        case CROARING_ART_NODE256_TYPE:
            return art_node256_erase(art, (art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return CROARING_ART_NULL_REF;
    }
}